

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_axis.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_axis::ChFunctionRotation_axis(ChFunctionRotation_axis *this)

{
  double dVar1;
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_axis_01192ad0;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fangle).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->axis).m_data[0] = 0.0;
  (this->axis).m_data[1] = 0.0;
  (this->axis).m_data[2] = 0.0;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->fangle,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  dVar1 = DAT_011dd428;
  if (this != (ChFunctionRotation_axis *)&VECT_Y) {
    (this->axis).m_data[0] = VECT_Z;
    (this->axis).m_data[1] = dVar1;
    (this->axis).m_data[2] = DAT_011dd430;
  }
  return;
}

Assistant:

ChFunctionRotation_axis::ChFunctionRotation_axis() {

	// default s(t) function. User will provide better fx.
    this->fangle = chrono_types::make_shared<ChFunction_Const>(0);
	this->axis = VECT_Z;
}